

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O2

int currencyNameComparator(void *a,void *b)

{
  ushort uVar1;
  ushort uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar3 = *(uint *)((long)a + 0x10);
  uVar4 = *(uint *)((long)b + 0x10);
  uVar5 = uVar4;
  if ((int)uVar3 < (int)uVar4) {
    uVar5 = uVar3;
  }
  uVar7 = 0;
  uVar6 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar6 = uVar7;
  }
  while( true ) {
    if (uVar6 == uVar7) {
      if ((int)uVar4 <= (int)uVar3) {
        return (uint)((int)uVar4 < (int)uVar3);
      }
      return -1;
    }
    uVar1 = *(ushort *)(*(long *)((long)a + 8) + uVar7 * 2);
    uVar2 = *(ushort *)(*(long *)((long)b + 8) + uVar7 * 2);
    if (uVar1 < uVar2) break;
    uVar7 = uVar7 + 1;
    if (uVar2 < uVar1) {
      return 1;
    }
  }
  return -1;
}

Assistant:

static int U_CALLCONV currencyNameComparator(const void* a, const void* b) {
    const CurrencyNameStruct* currName_1 = (const CurrencyNameStruct*)a;
    const CurrencyNameStruct* currName_2 = (const CurrencyNameStruct*)b;
    for (int32_t i = 0; 
         i < MIN(currName_1->currencyNameLen, currName_2->currencyNameLen);
         ++i) {
        if (currName_1->currencyName[i] < currName_2->currencyName[i]) {
            return -1;
        }
        if (currName_1->currencyName[i] > currName_2->currencyName[i]) {
            return 1;
        }
    }
    if (currName_1->currencyNameLen < currName_2->currencyNameLen) {
        return -1;
    } else if (currName_1->currencyNameLen > currName_2->currencyNameLen) {
        return 1;
    }
    return 0;
}